

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropframe_encode_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::DropFrameEncodeTestLarge_TestNoMisMatch_Test::
~DropFrameEncodeTestLarge_TestNoMisMatch_Test(DropFrameEncodeTestLarge_TestNoMisMatch_Test *this)

{
  DropFrameEncodeTestLarge_TestNoMisMatch_Test *in_stack_00000010;
  
  anon_unknown.dwarf_99cbc0::DropFrameEncodeTestLarge_TestNoMisMatch_Test::
  ~DropFrameEncodeTestLarge_TestNoMisMatch_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(DropFrameEncodeTestLarge, TestNoMisMatch) {
  cfg_.rc_end_usage = AOM_CBR;
  cfg_.rc_buf_sz = 1;
  cfg_.g_pass = AOM_RC_ONE_PASS;
  cfg_.rc_dropframe_thresh = 1;
  cfg_.g_threads = threads_;

  ::libaom_test::I420VideoSource video("desktopqvga2.320_240.yuv", 320, 240, 30,
                                       1, 0, 100);

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}